

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,char *name,
          char *description,SourceLineInfo *lineInfo)

{
  SourceLineInfo *__s;
  char *pcVar1;
  char *testCase_00;
  IMutableRegistryHub *pIVar2;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_141;
  string local_140;
  string local_120;
  TestCaseInfo local_100;
  SourceLineInfo *local_38;
  SourceLineInfo *lineInfo_local;
  char *description_local;
  char *name_local;
  char *classOrQualifiedMethodName_local;
  ITestCase *testCase_local;
  AutoReg *this_local;
  
  local_38 = lineInfo;
  lineInfo_local = (SourceLineInfo *)description;
  description_local = name;
  name_local = classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = (char *)testCase;
  testCase_local = (ITestCase *)this;
  pIVar2 = getMutableRegistryHub();
  testCase_00 = classOrQualifiedMethodName_local;
  pcVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,pcVar1,&local_141);
  extractClassName(&local_120,&local_140);
  pcVar1 = description_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar1,&local_179);
  __s = lineInfo_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,(char *)__s,&local_1a1);
  TestCaseInfo::TestCaseInfo
            (&local_100,(ITestCase *)testCase_00,&local_120,&local_178,&local_1a0,local_38);
  (*pIVar2->_vptr_IMutableRegistryHub[3])(pIVar2,&local_100);
  TestCaseInfo::~TestCaseInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    const char* classOrQualifiedMethodName,
                                    const char* name,
                                    const char* description,
                                    const SourceLineInfo& lineInfo ) {

        getMutableRegistryHub().registerTest( TestCaseInfo( testCase, extractClassName( classOrQualifiedMethodName ), name, description, lineInfo ) );
    }